

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TestTools.h
# Opt level: O2

bool containsLinkedToken(vector<LinkedToken,_std::allocator<LinkedToken>_> *linkedTokens,
                        LinkedToken *linkedTokenToFind)

{
  vector<LinkedToken,_std::allocator<LinkedToken>_> *pvVar1;
  IResultCapture *pIVar2;
  __normal_iterator<const_LinkedToken_*,_std::vector<LinkedToken,_std::allocator<LinkedToken>_>_>
  _Var3;
  LinkedToken *lt;
  pointer this;
  MessageBuilder local_108;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a8;
  string local_88;
  StringRef local_68;
  SourceLineInfo local_58;
  pointer local_48;
  LinkedToken *local_40;
  vector<LinkedToken,_std::allocator<LinkedToken>_> *local_38;
  
  pIVar2 = Catch::getResultCapture();
  local_68.m_start = "UNSCOPED_INFO";
  local_68.m_size = 0xd;
  local_58.file =
       "/workspace/llm4binary/github/license_c_cmakelists/Narase33[P]std_bot_cpp/test/TestTools.h";
  local_58.line = 0x3a;
  Catch::MessageBuilder::MessageBuilder(&local_108,&local_68,&local_58,Info);
  LinkedToken::toLink_abi_cxx11_(&local_88,linkedTokenToFind);
  std::operator+(&local_a8,"ToFind: ",
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_88);
  local_40 = linkedTokenToFind;
  std::operator<<(local_108.super_MessageStream.m_stream.m_oss,(string *)&local_a8);
  (*pIVar2->_vptr_IResultCapture[8])(pIVar2,&local_108);
  std::__cxx11::string::~string((string *)&local_a8);
  std::__cxx11::string::~string((string *)&local_88);
  Catch::MessageBuilder::~MessageBuilder(&local_108);
  local_48 = (linkedTokens->super__Vector_base<LinkedToken,_std::allocator<LinkedToken>_>)._M_impl.
             super__Vector_impl_data._M_finish;
  local_38 = linkedTokens;
  for (this = (linkedTokens->super__Vector_base<LinkedToken,_std::allocator<LinkedToken>_>)._M_impl.
              super__Vector_impl_data._M_start; pvVar1 = local_38, this != local_48; this = this + 1
      ) {
    pIVar2 = Catch::getResultCapture();
    local_68.m_start = "UNSCOPED_INFO";
    local_68.m_size = 0xd;
    local_58.file =
         "/workspace/llm4binary/github/license_c_cmakelists/Narase33[P]std_bot_cpp/test/TestTools.h"
    ;
    local_58.line = 0x3c;
    Catch::MessageBuilder::MessageBuilder(&local_108,&local_68,&local_58,Info);
    LinkedToken::toLink_abi_cxx11_(&local_88,this);
    std::operator+(&local_a8,"In list: ",
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_88);
    std::operator<<(local_108.super_MessageStream.m_stream.m_oss,(string *)&local_a8);
    (*pIVar2->_vptr_IResultCapture[8])(pIVar2,&local_108);
    std::__cxx11::string::~string((string *)&local_a8);
    std::__cxx11::string::~string((string *)&local_88);
    Catch::MessageBuilder::~MessageBuilder(&local_108);
  }
  _Var3 = std::
          __find_if<__gnu_cxx::__normal_iterator<LinkedToken_const*,std::vector<LinkedToken,std::allocator<LinkedToken>>>,__gnu_cxx::__ops::_Iter_pred<containsLinkedToken(std::vector<LinkedToken,std::allocator<LinkedToken>>const&,LinkedToken_const&)::_lambda(LinkedToken_const&)_1_>>
                    ((local_38->super__Vector_base<LinkedToken,_std::allocator<LinkedToken>_>).
                     _M_impl.super__Vector_impl_data._M_start,
                     (local_38->super__Vector_base<LinkedToken,_std::allocator<LinkedToken>_>).
                     _M_impl.super__Vector_impl_data._M_finish,local_40);
  return _Var3._M_current !=
         (pvVar1->super__Vector_base<LinkedToken,_std::allocator<LinkedToken>_>)._M_impl.
         super__Vector_impl_data._M_finish;
}

Assistant:

inline bool containsLinkedToken(const std::vector<LinkedToken>& linkedTokens, const LinkedToken& linkedTokenToFind) {
    UNSCOPED_INFO("ToFind: " + linkedTokenToFind.toLink());
    for (const LinkedToken& lt : linkedTokens) {
        UNSCOPED_INFO("In list: " + lt.toLink());
    }

    return std::find_if(linkedTokens.begin(), linkedTokens.end(), [&](const LinkedToken& t) {
        return (t.token.content == linkedTokenToFind.token.content) and (t.token.type == linkedTokenToFind.token.type) and (t.link == linkedTokenToFind.link);
    }) != linkedTokens.end();
}